

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

int __thiscall CChat::NextActiveCommand(CChat *this,int *pIndex)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  int *in_RSI;
  long in_RDI;
  undefined1 local_19;
  
  *in_RSI = *in_RSI + 1;
  while( true ) {
    iVar1 = *in_RSI;
    iVar2 = array<bool,_allocator_default<bool>_>::size
                      ((array<bool,_allocator_default<bool>_> *)(in_RDI + 0x363e0));
    local_19 = 0;
    if (iVar1 < iVar2) {
      pbVar3 = array<bool,_allocator_default<bool>_>::operator[]
                         ((array<bool,_allocator_default<bool>_> *)(in_RDI + 0x363e0),*in_RSI);
      local_19 = *pbVar3;
    }
    if ((local_19 & 1) == 0) break;
    *in_RSI = *in_RSI + 1;
  }
  return *in_RSI;
}

Assistant:

int CChat::NextActiveCommand(int *pIndex)
{
	(*pIndex)++;
	while(*pIndex < m_aFilter.size() && m_aFilter[*pIndex])
		(*pIndex)++;
	return *pIndex;
}